

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int CollectionStore(unqlite_col *pCol,jx9_value *pValue)

{
  unqlite_kv_methods *puVar1;
  int iVar2;
  SyBlob *pBlob;
  unqlite_kv_engine *puVar3;
  undefined1 local_80 [8];
  jx9_value sId;
  int rc;
  sxu32 nKeyLen;
  unqlite_kv_engine *pEngine;
  unqlite_kv_methods *pMethods;
  SyBlob *pWorker;
  jx9_value *pValue_local;
  unqlite_col *pCol_local;
  
  pBlob = &pCol->sWorker;
  puVar3 = unqlitePagerGetKvEngine(pCol->pVm->pDb);
  puVar1 = puVar3->pIo->pMethods;
  if (pCol->nTotRec < 0x7fffffffffffffff) {
    if (puVar1->xReplace ==
        (_func_int_unqlite_kv_engine_ptr_void_ptr_int_void_ptr_unqlite_int64 *)0x0) {
      unqliteGenErrorFormat
                (pCol->pVm->pDb,
                 "Cannot store record into collection \'%z\' due to a read-only Key/Value storage engine"
                 ,&pCol->sName);
      pCol_local._4_4_ = 0xffffffb5;
    }
    else {
      SyBlobReset(pBlob);
      iVar2 = jx9_value_is_json_object(pValue);
      if (iVar2 != 0) {
        jx9MemObjInitFromInt(pCol->pVm->pJx9Vm,(jx9_value *)local_80,pCol->nLastid);
        jx9_array_add_strkey_elem(pValue,"__id",(jx9_value *)local_80);
        jx9MemObjRelease((jx9_value *)local_80);
      }
      SyBlobFormat(pBlob,"%z_%qd",&pCol->sName,pCol->nLastid);
      sId._60_4_ = (pCol->sWorker).nByte;
      if (sId._60_4_ == 0) {
        unqliteGenOutofMem(pCol->pVm->pDb);
        pCol_local._4_4_ = 0xffffffff;
      }
      else {
        sId.nIdx = FastJsonEncode(pValue,pBlob,0);
        pCol_local._4_4_ = sId.nIdx;
        if (sId.nIdx == 0) {
          sId.nIdx = (*puVar1->xReplace)(puVar3,(pCol->sWorker).pBlob,sId._60_4_,
                                         (void *)((long)(pCol->sWorker).pBlob +
                                                 (ulong)(uint)sId._60_4_),
                                         (long)(pCol->sWorker).nByte + sId._60_8_ * 0xffffffff);
          if (sId.nIdx == 0) {
            CollectionCacheInstallRecord(pCol,pCol->nLastid,pValue);
            pCol->nLastid = pCol->nLastid + 1;
            pCol->nTotRec = pCol->nTotRec + 1;
            sId.nIdx = CollectionSetHeader((unqlite_kv_engine *)0x0,pCol,pCol->nLastid,pCol->nTotRec
                                           ,(jx9_value *)0x0);
          }
          if (sId.nIdx == 0) {
            pCol_local._4_4_ = 0;
          }
          else {
            unqliteGenErrorFormat
                      (pCol->pVm->pDb,"IO error while storing record into collection \'%z\'",
                       &pCol->sName);
            pCol_local._4_4_ = sId.nIdx;
          }
        }
      }
    }
  }
  else {
    unqliteGenErrorFormat(pCol->pVm->pDb,"Collection \'%z\': Records limit reached",&pCol->sName);
    pCol_local._4_4_ = 0xfffffff9;
  }
  return pCol_local._4_4_;
}

Assistant:

static int CollectionStore(
	unqlite_col *pCol, /* Target collection */
	jx9_value *pValue  /* JSON value to be stored */
	)
{
	SyBlob *pWorker = &pCol->sWorker;
	unqlite_kv_methods *pMethods;
	unqlite_kv_engine *pEngine;
	sxu32 nKeyLen;
	int rc;	
	/* Point to the underlying KV store */
	pEngine = unqlitePagerGetKvEngine(pCol->pVm->pDb);
	pMethods = pEngine->pIo->pMethods;
	if( pCol->nTotRec >= SXI64_HIGH ){
		/* Collection limit reached. No more records */
		unqliteGenErrorFormat(pCol->pVm->pDb,
				"Collection '%z': Records limit reached",
				&pCol->sName
			);
		return UNQLITE_LIMIT;
	}
	if( pMethods->xReplace == 0 ){
		unqliteGenErrorFormat(pCol->pVm->pDb,
				"Cannot store record into collection '%z' due to a read-only Key/Value storage engine",
				&pCol->sName
			);
		return UNQLITE_READ_ONLY;
	}
	/* Reset the working buffer */
	SyBlobReset(pWorker);
	if( jx9_value_is_json_object(pValue) ){
		jx9_value sId;
		/* If the given type is a JSON object, then add the special __id field */
		jx9MemObjInitFromInt(pCol->pVm->pJx9Vm,&sId,pCol->nLastid);
		jx9_array_add_strkey_elem(pValue,"__id",&sId);
		jx9MemObjRelease(&sId);
	}
	/* Prepare the unique ID for this record */
	SyBlobFormat(pWorker,"%z_%qd",&pCol->sName,pCol->nLastid);
	nKeyLen = SyBlobLength(pWorker);
	if( nKeyLen < 1 ){
		unqliteGenOutofMem(pCol->pVm->pDb);
		return UNQLITE_NOMEM;
	}
	/* Turn to FastJson */
	rc = FastJsonEncode(pValue,pWorker,0);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Finally perform the insertion */
	rc = pMethods->xReplace(
		pEngine,
		SyBlobData(pWorker),nKeyLen,
		SyBlobDataAt(pWorker,nKeyLen),SyBlobLength(pWorker)-nKeyLen
		);
	if( rc == UNQLITE_OK ){
		/* Save the value in the cache */
		CollectionCacheInstallRecord(pCol,pCol->nLastid,pValue);
		/* Increment the unique __id */
		pCol->nLastid++;
		pCol->nTotRec++;
		/* Reflect the change */
		rc = CollectionSetHeader(0,pCol,pCol->nLastid,pCol->nTotRec,0);
	}
	if( rc != UNQLITE_OK ){
		unqliteGenErrorFormat(pCol->pVm->pDb,
				"IO error while storing record into collection '%z'",
				&pCol->sName
			);
		return rc;
	}
	return UNQLITE_OK;
}